

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::
SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ImmutableSamplerDesc_const&)>
          (Serializer<(Diligent::SerializerMode)1> *this,DynamicLinearAllocator *Allocator,
          ImmutableSamplerDesc **SrcArray,uint *Count,
          _func_bool_Serializer<(Diligent::SerializerMode)1>_ptr_ImmutableSamplerDesc_ptr
          *ElemSerializer)

{
  bool bVar1;
  Char *Message;
  ulong uVar2;
  ulong local_70;
  size_t i;
  undefined1 local_58 [8];
  string msg;
  _func_bool_Serializer<(Diligent::SerializerMode)1>_ptr_ImmutableSamplerDesc_ptr
  *ElemSerializer_local;
  uint *Count_local;
  ImmutableSamplerDesc **SrcArray_local;
  DynamicLinearAllocator *Allocator_local;
  Serializer<(Diligent::SerializerMode)1> *this_local;
  
  msg.field_2._8_8_ = ElemSerializer;
  if ((*SrcArray != (ImmutableSamplerDesc *)0x0) != (*Count != 0)) {
    FormatString<char[26],char[38]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcArray != nullptr) == (Count != 0)",
               (char (*) [38])(ulong)(*Count != 0));
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1bd);
    std::__cxx11::string::~string((string *)local_58);
  }
  bVar1 = operator()(this,Count);
  if (bVar1) {
    for (local_70 = 0; local_70 < *Count; local_70 = local_70 + 1) {
      uVar2 = (*(code *)msg.field_2._8_8_)(this,*SrcArray + local_70);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Serializer<Mode>::SerializeArray(DynamicLinearAllocator* Allocator,
                                      ElemPtrType&            SrcArray,
                                      CountType&              Count,
                                      ArrayElemSerializerType ElemSerializer)
{
    VERIFY_EXPR((SrcArray != nullptr) == (Count != 0));

    if (!(*this)(Count))
        return false;

    for (size_t i = 0; i < static_cast<size_t>(Count); ++i)
    {
        if (!ElemSerializer(*this, SrcArray[i]))
            return false;
    }

    return true;
}